

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  short sVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  undefined4 uVar15;
  uint uVar16;
  size_t u;
  long lVar17;
  int iVar18;
  
  bVar2 = (byte)tableLog;
  uVar12 = 1 << (bVar2 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d5,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d6,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d7,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar7 = maxSymbolValue + 1;
  lVar6 = (long)wksp + 0x6a;
  uVar8 = uVar12 - 1;
  uVar15 = 1;
  uVar4 = 0;
  uVar3 = uVar8;
  do {
    uVar11 = normalizedCounter[uVar4];
    if (uVar11 == 0xffff) {
      uVar10 = (ulong)uVar3;
      uVar3 = uVar3 - 1;
      dt[uVar10 + 1].baseValue = (U32)uVar4;
      uVar11 = 1;
    }
    else {
      if ((short)uVar11 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x1e5,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if ((0x10000 << (bVar2 - 1 & 0x1f)) >> 0x10 <= (int)(uint)uVar11) {
        uVar15 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar4 * 2) = uVar11;
    uVar4 = uVar4 + 1;
  } while (uVar7 != uVar4);
  dt->nextState = (short)uVar15;
  dt->nbAdditionalBits = (char)((uint)uVar15 >> 0x10);
  dt->nbBits = (char)((uint)uVar15 >> 0x18);
  dt->baseValue = tableLog;
  if (uVar3 == uVar8) {
    iVar18 = (uVar12 >> 3) + (uVar12 >> 1) + 3;
    uVar4 = 0;
    lVar17 = 0;
    lVar9 = 0;
    do {
      sVar1 = normalizedCounter[uVar4];
      uVar10 = (ulong)sVar1;
      *(long *)(lVar6 + lVar17) = lVar9;
      if (8 < (long)uVar10) {
        lVar13 = 0x72;
        do {
          *(long *)((long)wksp + lVar13 + lVar17) = lVar9;
          uVar14 = lVar13 - 0x62;
          lVar13 = lVar13 + 8;
        } while (uVar14 < uVar10);
      }
      if (sVar1 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x207,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar17 = lVar17 + uVar10;
      uVar4 = uVar4 + 1;
      lVar9 = lVar9 + 0x101010101010101;
    } while (uVar4 != uVar7 + (uVar7 == 0));
    if ((uVar12 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x215,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar4 = 0;
    uVar3 = 0;
    do {
      lVar9 = 0;
      uVar7 = uVar3;
      do {
        dt[(ulong)(uVar7 & uVar8) + 1].baseValue = (uint)*(byte *)(lVar6 + lVar9);
        lVar9 = lVar9 + 1;
        uVar7 = uVar7 + iVar18;
      } while (lVar9 == 1);
      uVar3 = uVar3 + iVar18 * 2 & uVar8;
      uVar4 = uVar4 + 2;
      lVar6 = lVar6 + 2;
    } while (uVar4 < uVar12);
    if (uVar3 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x21e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar10 = 0;
    uVar4 = 0;
    do {
      sVar1 = normalizedCounter[uVar10];
      if (0 < sVar1) {
        iVar18 = 0;
        do {
          dt[uVar4 + 1].baseValue = (U32)uVar10;
          do {
            uVar16 = (int)uVar4 + (uVar12 >> 3) + (uVar12 >> 1) + 3 & uVar8;
            uVar4 = (ulong)uVar16;
          } while (uVar3 < uVar16);
          iVar18 = iVar18 + 1;
        } while (iVar18 != sVar1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar7 + (uVar7 == 0));
    if ((int)uVar4 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x22c,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar4 = 0;
  while( true ) {
    uVar10 = (ulong)dt[uVar4 + 1].baseValue;
    uVar11 = *(ushort *)((long)wksp + uVar10 * 2);
    *(ushort *)((long)wksp + uVar10 * 2) = uVar11 + 1;
    if (uVar11 == 0) {
      __assert_fail("val != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                    ,0xab,"unsigned int ZSTD_highbit32(U32)");
    }
    iVar18 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    bVar5 = bVar2 - (char)iVar18;
    dt[uVar4 + 1].nbBits = bVar5;
    dt[uVar4 + 1].nextState = (uVar11 << (bVar5 & 0x1f)) - (short)uVar12;
    if (nbAdditionalBits[uVar10] == 0xff) break;
    dt[uVar4 + 1].nbAdditionalBits = nbAdditionalBits[uVar10];
    dt[uVar4 + 1].baseValue = baseValue[uVar10];
    uVar4 = uVar4 + 1;
    if (uVar12 == uVar4) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                ,0x237,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}